

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_abs64_sparc64(void *d,void *a,uint32_t desc)

{
  intptr_t oprsz_00;
  long local_40;
  int64_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (aa = 0; aa < oprsz_00; aa = aa + 8) {
    local_40 = *(long *)((long)a + aa);
    if (local_40 < 0) {
      local_40 = -local_40;
    }
    *(long *)((long)d + aa) = local_40;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_abs64)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t aa = *(int64_t *)((char *)a + i);
        *(int64_t *)((char *)d + i) = aa < 0 ? -aa : aa;
    }
    clear_high(d, oprsz, desc);
}